

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O3

HighsBasisStatus
checkedVarHighsNonbasicStatus(HighsBasisStatus ideal_status,double lower,double upper)

{
  bool bVar1;
  HighsBasisStatus HVar2;
  HighsBasisStatus HVar3;
  undefined3 in_register_00000039;
  double local_18;
  
  if ((CONCAT31(in_register_00000039,ideal_status) == 3) ||
     (CONCAT31(in_register_00000039,ideal_status) == 0)) {
    bVar1 = highs_isInfinity(-lower);
    HVar3 = kUpper;
    local_18 = upper;
    if (!bVar1) {
      return kLower;
    }
  }
  else {
    bVar1 = highs_isInfinity(upper);
    if (!bVar1) {
      return kUpper;
    }
    HVar3 = kLower;
    local_18 = -lower;
  }
  bVar1 = highs_isInfinity(local_18);
  HVar2 = kZero;
  if (!bVar1) {
    HVar2 = HVar3;
  }
  return HVar2;
}

Assistant:

HighsBasisStatus checkedVarHighsNonbasicStatus(
    const HighsBasisStatus ideal_status, const double lower,
    const double upper) {
  HighsBasisStatus checked_status;
  if (ideal_status == HighsBasisStatus::kLower ||
      ideal_status == HighsBasisStatus::kZero) {
    // Looking to give status LOWER or ZERO
    if (highs_isInfinity(-lower)) {
      // Lower bound is infinite
      if (highs_isInfinity(upper)) {
        // Upper bound is infinite
        checked_status = HighsBasisStatus::kZero;
      } else {
        // Upper bound is finite
        checked_status = HighsBasisStatus::kUpper;
      }
    } else {
      checked_status = HighsBasisStatus::kLower;
    }
  } else {
    // Looking to give status UPPER
    if (highs_isInfinity(upper)) {
      // Upper bound is infinite
      if (highs_isInfinity(-lower)) {
        // Lower bound is infinite
        checked_status = HighsBasisStatus::kZero;
      } else {
        // Upper bound is finite
        checked_status = HighsBasisStatus::kLower;
      }
    } else {
      checked_status = HighsBasisStatus::kUpper;
    }
  }
  return checked_status;
}